

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcolsb.c
# Opt level: O3

int fffi1s1(uchar *input,long ntodo,double scale,double zero,int nullcheck,uchar tnull,char nullval,
           char *nullarray,int *anynull,char *output,int *status)

{
  char cVar1;
  uchar uVar2;
  char cVar3;
  uchar uVar4;
  long lVar5;
  char *pcVar6;
  double dVar7;
  
  if (nullcheck == 0) {
    if (scale != 1.0 || zero != -128.0) {
      if ((((scale != 1.0) || (NAN(scale))) || (zero != 0.0)) || (NAN(zero))) {
        if (0 < ntodo) {
          lVar5 = 0;
          do {
            dVar7 = (double)input[lVar5] * scale + zero;
            if (-128.49 <= dVar7) {
              if (dVar7 <= 127.49) {
                cVar1 = (char)(int)dVar7;
              }
              else {
                *status = -0xb;
                cVar1 = '\x7f';
              }
            }
            else {
              *status = -0xb;
              cVar1 = -0x80;
            }
            output[lVar5] = cVar1;
            lVar5 = lVar5 + 1;
          } while (ntodo != lVar5);
        }
      }
      else if (0 < ntodo) {
        lVar5 = 0;
        do {
          uVar2 = input[lVar5];
          if ((char)uVar2 < '\0') {
            *status = -0xb;
            uVar2 = '\x7f';
          }
          output[lVar5] = uVar2;
          lVar5 = lVar5 + 1;
        } while (ntodo != lVar5);
      }
    }
    else if (0 < ntodo) {
      lVar5 = 0;
      do {
        output[lVar5] = input[lVar5] + 0x80;
        lVar5 = lVar5 + 1;
      } while (ntodo != lVar5);
    }
  }
  else if (scale != 1.0 || zero != -128.0) {
    if (((scale != 1.0) || (NAN(scale))) || ((zero != 0.0 || (NAN(zero))))) {
      if (0 < ntodo) {
        lVar5 = 0;
        do {
          if (input[lVar5] == tnull) {
            *anynull = 1;
            if (nullcheck == 1) {
              output[lVar5] = nullval;
            }
            else {
              nullarray[lVar5] = '\x01';
            }
          }
          else {
            dVar7 = (double)input[lVar5] * scale + zero;
            if (-128.49 <= dVar7) {
              if (dVar7 <= 127.49) {
                output[lVar5] = (char)(int)dVar7;
              }
              else {
                *status = -0xb;
                output[lVar5] = '\x7f';
              }
            }
            else {
              *status = -0xb;
              output[lVar5] = -0x80;
            }
          }
          lVar5 = lVar5 + 1;
        } while (ntodo != lVar5);
      }
    }
    else if (0 < ntodo) {
      if (nullcheck == 1) {
        nullarray = output;
      }
      uVar2 = '\x01';
      if (nullcheck == 1) {
        uVar2 = nullval;
      }
      lVar5 = 0;
      do {
        pcVar6 = output;
        uVar4 = input[lVar5];
        if (input[lVar5] == tnull) {
          *anynull = 1;
          pcVar6 = nullarray;
          uVar4 = uVar2;
        }
        pcVar6[lVar5] = uVar4;
        lVar5 = lVar5 + 1;
      } while (ntodo != lVar5);
    }
  }
  else if (0 < ntodo) {
    if (nullcheck == 1) {
      nullarray = output;
    }
    cVar1 = '\x01';
    if (nullcheck == 1) {
      cVar1 = nullval;
    }
    lVar5 = 0;
    do {
      if (input[lVar5] == tnull) {
        *anynull = 1;
        pcVar6 = nullarray;
        cVar3 = cVar1;
      }
      else {
        cVar3 = input[lVar5] + 0x80;
        pcVar6 = output;
      }
      pcVar6[lVar5] = cVar3;
      lVar5 = lVar5 + 1;
    } while (ntodo != lVar5);
  }
  return *status;
}

Assistant:

int fffi1s1(unsigned char *input, /* I - array of values to be converted     */
            long ntodo,           /* I - number of elements in the array     */
            double scale,         /* I - FITS TSCALn or BSCALE value         */
            double zero,          /* I - FITS TZEROn or BZERO  value         */
            int nullcheck,        /* I - null checking code; 0 = don't check */
                                  /*     1:set null pixels = nullval         */
                                  /*     2: if null pixel, set nullarray = 1 */
            unsigned char tnull,  /* I - value of FITS TNULLn keyword if any */
            signed char nullval,  /* I - set null pixels, if nullcheck = 1   */
            char *nullarray,      /* I - bad pixel array, if nullcheck = 2   */
            int  *anynull,        /* O - set to 1 if any pixels are null     */
            signed char *output,  /* O - array of converted pixels           */
            int *status)          /* IO - error status                       */
/*
  Copy input to output following reading of the input from a FITS file.
  Check for null values and do datatype conversion and scaling if required.
  The nullcheck code value determines how any null values in the input array
  are treated.  A null value is an input pixel that is equal to tnull.  If 
  nullcheck = 0, then no checking for nulls is performed and any null values
  will be transformed just like any other pixel.  If nullcheck = 1, then the
  output pixel will be set = nullval if the corresponding input pixel is null.
  If nullcheck = 2, then if the pixel is null then the corresponding value of
  nullarray will be set to 1; the value of nullarray for non-null pixels 
  will = 0.  The anynull parameter will be set = 1 if any of the returned
  pixels are null, otherwise anynull will be returned with a value = 0;
*/
{
    long ii;
    double dvalue;

    if (nullcheck == 0)     /* no null checking required */
    {
        if (scale == 1. && zero == -128.)
        {
            /* Instead of subtracting 128, it is more efficient */
            /* to just flip the sign bit with the XOR operator */

            for (ii = 0; ii < ntodo; ii++)
                 output[ii] =  ( *(signed char *) &input[ii] ) ^ 0x80;
        }
        else if (scale == 1. && zero == 0.)      /* no scaling */
        { 
            for (ii = 0; ii < ntodo; ii++)
            {
                if (input[ii] > 127)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = 127;
                }
                else
                    output[ii] = (signed char) input[ii]; /* copy input */
            }
        }
        else             /* must scale the data */
        {                
            for (ii = 0; ii < ntodo; ii++)
            {
                dvalue = input[ii] * scale + zero;

                if (dvalue < DSCHAR_MIN)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = -128;
                }
                else if (dvalue > DSCHAR_MAX)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = 127;
                }
                else
                    output[ii] = (signed char) dvalue;
            }
        }
    }
    else        /* must check for null values */
    {
        if (scale == 1. && zero == -128.)
        {
            /* Instead of subtracting 128, it is more efficient */
            /* to just flip the sign bit with the XOR operator */

            for (ii = 0; ii < ntodo; ii++)
            {
                if (input[ii] == tnull)
                {
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                        nullarray[ii] = 1;
                }
                else
                    output[ii] =  ( *(signed char *) &input[ii] ) ^ 0x80;
            }
        }
        else if (scale == 1. && zero == 0.)  /* no scaling */
        {       
            for (ii = 0; ii < ntodo; ii++)
            {
                if (input[ii] == tnull)
                {
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                        nullarray[ii] = 1;
                }
                else
                    output[ii] = (signed char) input[ii];
            }
        }
        else                  /* must scale the data */
        {
            for (ii = 0; ii < ntodo; ii++)
            {
                if (input[ii] == tnull)
                {
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                        nullarray[ii] = 1;
                }
                else
                {
                    dvalue = input[ii] * scale + zero;

                    if (dvalue < DSCHAR_MIN)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = -128;
                    }
                    else if (dvalue > DSCHAR_MAX)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = 127;
                    }
                    else
                        output[ii] = (signed char) dvalue;
                }
            }
        }
    }
    return(*status);
}